

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

bool __thiscall
udpdiscovery::impl::PeerEnv::Start(PeerEnv *this,PeerParameters *parameters,string *user_data)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  SamePeerMode SVar8;
  ProtocolVersion PVar9;
  ProtocolVersion PVar10;
  bool bVar11;
  bool bVar12;
  undefined2 uVar13;
  uint32_t uVar14;
  int iVar15;
  time_t tVar16;
  ostream *poVar17;
  char *pcVar18;
  int value;
  undefined4 uStack_3c;
  undefined8 local_38;
  int reuse_port;
  char local_2c [12];
  
  PVar9 = parameters->min_supported_protocol_version_;
  PVar10 = parameters->max_supported_protocol_version_;
  uVar14 = parameters->application_id_;
  bVar11 = parameters->can_use_broadcast_;
  bVar12 = parameters->can_use_multicast_;
  uVar13 = *(undefined2 *)&parameters->field_0xe;
  iVar15 = parameters->port_;
  uVar2 = parameters->multicast_group_address_;
  lVar3 = parameters->send_timeout_ms_;
  bVar4 = parameters->can_be_discovered_;
  bVar5 = parameters->can_discover_;
  bVar6 = parameters->discover_self_;
  uVar7 = parameters->field_0x2b;
  SVar8 = parameters->same_peer_mode_;
  (this->parameters_).discovered_peer_ttl_ms_ = parameters->discovered_peer_ttl_ms_;
  (this->parameters_).can_be_discovered_ = bVar4;
  (this->parameters_).can_discover_ = bVar5;
  (this->parameters_).discover_self_ = bVar6;
  (this->parameters_).field_0x2b = uVar7;
  (this->parameters_).same_peer_mode_ = SVar8;
  (this->parameters_).port_ = iVar15;
  (this->parameters_).multicast_group_address_ = uVar2;
  (this->parameters_).send_timeout_ms_ = lVar3;
  (this->parameters_).min_supported_protocol_version_ = PVar9;
  (this->parameters_).max_supported_protocol_version_ = PVar10;
  (this->parameters_).application_id_ = uVar14;
  (this->parameters_).can_use_broadcast_ = bVar11;
  (this->parameters_).can_use_multicast_ = bVar12;
  *(undefined2 *)&(this->parameters_).field_0xe = uVar13;
  std::__cxx11::string::_M_assign((string *)&this->user_data_);
  if (((this->parameters_).can_use_broadcast_ == false) &&
     ((this->parameters_).can_use_multicast_ == false)) {
    pcVar18 = "udpdiscovery::Peer can\'t use broadcast and can\'t use multicast.";
  }
  else if (((this->parameters_).can_discover_ == false) &&
          ((this->parameters_).can_be_discovered_ == false)) {
    pcVar18 = "udpdiscovery::Peer can\'t discover and can\'t be discovered.";
  }
  else {
    tVar16 = time((time_t *)0x0);
    srand((uint)tVar16);
    uVar14 = rand();
    this->peer_id_ = uVar14;
    iVar15 = socket(2,2,0);
    this->sock_ = iVar15;
    if (iVar15 == -1) {
      pcVar18 = "udpdiscovery::Peer can\'t create socket.";
    }
    else {
      _value = CONCAT44(uStack_3c,1);
      setsockopt(iVar15,1,6,&value,4);
      if ((this->parameters_).can_discover_ != true) {
        return true;
      }
      iVar15 = socket(2,2,0);
      this->binding_sock_ = iVar15;
      if (iVar15 == -1) {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "udpdiscovery::Peer can\'t create binding socket.");
        std::endl<char,std::char_traits<char>>(poVar17);
        close(this->sock_);
        this->sock_ = -1;
        iVar15 = this->binding_sock_;
      }
      _value = CONCAT44(uStack_3c,1);
      setsockopt(iVar15,1,2,&value,4);
      reuse_port = 1;
      setsockopt(this->binding_sock_,1,0xf,&reuse_port,4);
      if ((this->parameters_).can_use_multicast_ == true) {
        uVar2 = (this->parameters_).multicast_group_address_;
        _value = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
        setsockopt(this->binding_sock_,0,0x23,&value,8);
      }
      local_2c[4] = '\0';
      local_2c[5] = '\0';
      local_2c[6] = '\0';
      local_2c[7] = '\0';
      local_2c[8] = '\0';
      local_2c[9] = '\0';
      local_2c[10] = '\0';
      local_2c[0xb] = '\0';
      uVar1 = (ushort)(this->parameters_).port_;
      reuse_port = CONCAT22(uVar1 << 8 | uVar1 >> 8,2);
      local_2c[0] = '\0';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      iVar15 = bind(this->binding_sock_,(sockaddr *)&reuse_port,0x10);
      if (-1 < iVar15) {
        _value = 1;
        local_38 = 0;
        setsockopt(this->binding_sock_,1,0x14,&value,0x10);
        return true;
      }
      close(this->binding_sock_);
      this->binding_sock_ = -1;
      close(this->sock_);
      this->sock_ = -1;
      pcVar18 = "udpdiscovery::Peer can\'t bind socket.";
    }
  }
  poVar17 = std::operator<<((ostream *)&std::cerr,pcVar18);
  std::endl<char,std::char_traits<char>>(poVar17);
  return false;
}

Assistant:

bool Start(const PeerParameters& parameters, const std::string& user_data) {
    parameters_ = parameters;
    user_data_ = user_data;

    if (!parameters_.can_use_broadcast() && !parameters_.can_use_multicast()) {
      std::cerr
          << "udpdiscovery::Peer can't use broadcast and can't use multicast."
          << std::endl;
      return false;
    }

    if (!parameters_.can_discover() && !parameters_.can_be_discovered()) {
      std::cerr << "udpdiscovery::Peer can't discover and can't be discovered."
                << std::endl;
      return false;
    }

    InitSockets();

    peer_id_ = MakeRandomId();

    sock_ = socket(AF_INET, SOCK_DGRAM, 0);
    if (sock_ == kInvalidSocket) {
      std::cerr << "udpdiscovery::Peer can't create socket." << std::endl;
      return false;
    }

    {
      int value = 1;
      setsockopt(sock_, SOL_SOCKET, SO_BROADCAST, (const char*)&value,
                 sizeof(value));
    }

    if (parameters_.can_discover()) {
      binding_sock_ = socket(AF_INET, SOCK_DGRAM, 0);
      if (binding_sock_ == kInvalidSocket) {
        std::cerr << "udpdiscovery::Peer can't create binding socket."
                  << std::endl;

        CloseSocket(sock_);
        sock_ = kInvalidSocket;
      }

      {
        int reuse_addr = 1;
        setsockopt(binding_sock_, SOL_SOCKET, SO_REUSEADDR,
                   (const char*)&reuse_addr, sizeof(reuse_addr));
#ifdef SO_REUSEPORT
        int reuse_port = 1;
        setsockopt(binding_sock_, SOL_SOCKET, SO_REUSEPORT,
                   (const char*)&reuse_port, sizeof(reuse_port));
#endif
      }

      if (parameters_.can_use_multicast()) {
        struct ip_mreq mreq;
        mreq.imr_multiaddr.s_addr =
            htonl(parameters_.multicast_group_address());
        mreq.imr_interface.s_addr = INADDR_ANY;
        setsockopt(binding_sock_, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                   (const char*)&mreq, sizeof(mreq));
      }

      sockaddr_in addr;
      memset((char*)&addr, 0, sizeof(sockaddr_in));
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(INADDR_ANY);

      if (bind(binding_sock_, (struct sockaddr*)&addr, sizeof(sockaddr_in)) <
          0) {
        CloseSocket(binding_sock_);
        binding_sock_ = kInvalidSocket;

        CloseSocket(sock_);
        sock_ = kInvalidSocket;

        std::cerr << "udpdiscovery::Peer can't bind socket." << std::endl;
        return false;
      }

      // TODO: Implement the way to unblock recvfrom without timeouting.
      SetSocketTimeout(binding_sock_, SO_RCVTIMEO, 1000);
    }

    return true;
  }